

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O0

int mbedtls_entropy_add_source
              (mbedtls_entropy_context *ctx,mbedtls_entropy_f_source_ptr f_source,void *p_source,
              size_t threshold,int strong)

{
  int iVar1;
  int local_34;
  int ret;
  int idx;
  int strong_local;
  size_t threshold_local;
  void *p_source_local;
  mbedtls_entropy_f_source_ptr f_source_local;
  mbedtls_entropy_context *ctx_local;
  
  local_34 = 0;
  iVar1 = ctx->source_count;
  if (iVar1 < 1) {
    ctx->source[iVar1].f_source = f_source;
    ctx->source[iVar1].p_source = p_source;
    ctx->source[iVar1].threshold = threshold;
    ctx->source[iVar1].strong = strong;
    ctx->source_count = ctx->source_count + 1;
  }
  else {
    local_34 = -0x3e;
  }
  return local_34;
}

Assistant:

int mbedtls_entropy_add_source(mbedtls_entropy_context *ctx,
                               mbedtls_entropy_f_source_ptr f_source, void *p_source,
                               size_t threshold, int strong)
{
    int idx, ret = 0;

#if defined(MBEDTLS_THREADING_C)
    if ((ret = mbedtls_mutex_lock(&ctx->mutex)) != 0) {
        return ret;
    }
#endif

    idx = ctx->source_count;
    if (idx >= MBEDTLS_ENTROPY_MAX_SOURCES) {
        ret = MBEDTLS_ERR_ENTROPY_MAX_SOURCES;
        goto exit;
    }

    ctx->source[idx].f_source  = f_source;
    ctx->source[idx].p_source  = p_source;
    ctx->source[idx].threshold = threshold;
    ctx->source[idx].strong    = strong;

    ctx->source_count++;

exit:
#if defined(MBEDTLS_THREADING_C)
    if (mbedtls_mutex_unlock(&ctx->mutex) != 0) {
        return MBEDTLS_ERR_THREADING_MUTEX_ERROR;
    }
#endif

    return ret;
}